

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O3

int __thiscall
aeron::archive::ArchiveProxy::connect(ArchiveProxy *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  ConnectRequest *this_00;
  undefined7 extraout_var;
  undefined4 in_register_0000000c;
  int64_t val;
  int32_t val_1;
  undefined4 in_register_00000034;
  ConnectRequest msg;
  ConnectRequest local_68;
  
  local_68.m_offset = 0;
  local_68.m_buffer = (char *)0x0;
  local_68.m_bufferLength = 0;
  this_00 = wrapAndApplyHeader<io::aeron::archive::codecs::ConnectRequest>(this,&local_68);
  *(ulong *)(this_00->m_buffer + this_00->m_offset) = CONCAT44(in_register_0000000c,__len);
  *(int *)(this_00->m_buffer + this_00->m_offset + 8) = (int)__addr;
  io::aeron::archive::codecs::ConnectRequest::putResponseChannel
            (this_00,(string *)CONCAT44(in_register_00000034,__fd));
  bVar1 = offerWithTimeout(this,(int)local_68.m_position - (int)local_68.m_offset,
                           (AgentInvoker<aeron::ClientConductor> *)0x0);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool ArchiveProxy::connect(const std::string& responseChannel, std::int32_t responseStreamId,
                           std::int64_t correlationId) {
    codecs::ConnectRequest msg;

    wrapAndApplyHeader(msg)
        .correlationId(correlationId)
        .responseStreamId(responseStreamId)
        .putResponseChannel(responseChannel);

    return offerWithTimeout(msg.encodedLength(), nullptr);
}